

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprIsSingleTableConstraint(Expr *pExpr,SrcList *pSrcList,int iSrc,int bAllowSubq)

{
  int iVar1;
  Expr *p;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int jj;
  SrcItem *pSrc;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  
  p = (Expr *)(in_RSI + 8 + (long)in_EDX * 0x48);
  if (((ulong)p->pRight & 0x40) != 0) {
    return 0;
  }
  if (((ulong)p->pRight & 8) == 0) {
    if ((*(uint *)(in_RDI + 4) & 1) != 0) {
      return 0;
    }
  }
  else {
    if ((*(uint *)(in_RDI + 4) & 1) == 0) {
      return 0;
    }
    if (*(int *)(in_RDI + 0x34) != *(int *)((long)&p->pRight + 4)) {
      return 0;
    }
  }
  if (((*(uint *)(in_RDI + 4) & 3) != 0) && ((*(byte *)(in_RSI + 0x20) & 0x40) != 0)) {
    for (in_stack_ffffffffffffffd4 = 0; in_stack_ffffffffffffffd4 < in_EDX;
        in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1) {
      if (*(int *)(in_RDI + 0x34) ==
          *(int *)(in_RSI + (long)in_stack_ffffffffffffffd4 * 0x48 + 0x24)) {
        if ((*(byte *)(in_RSI + (long)in_stack_ffffffffffffffd4 * 0x48 + 0x20) & 0x40) != 0) {
          return 0;
        }
        break;
      }
    }
  }
  iVar1 = sqlite3ExprIsTableConstant(p,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprIsSingleTableConstraint(
  Expr *pExpr,                 /* The constraint */
  const SrcList *pSrcList,     /* Complete FROM clause */
  int iSrc,                    /* Which element of pSrcList to use */
  int bAllowSubq               /* Allow non-correlated subqueries */
){
  const SrcItem *pSrc = &pSrcList->a[iSrc];
  if( pSrc->fg.jointype & JT_LTORJ ){
    return 0;  /* rule (3) */
  }
  if( pSrc->fg.jointype & JT_LEFT ){
    if( !ExprHasProperty(pExpr, EP_OuterON) ) return 0;   /* rule (4a) */
    if( pExpr->w.iJoin!=pSrc->iCursor ) return 0;         /* rule (4b) */
  }else{
    if( ExprHasProperty(pExpr, EP_OuterON) ) return 0;    /* rule (5) */
  }
  if( ExprHasProperty(pExpr, EP_OuterON|EP_InnerON)  /* (6a) */
   && (pSrcList->a[0].fg.jointype & JT_LTORJ)!=0     /* Fast pre-test of (6b) */
  ){
    int jj;
    for(jj=0; jj<iSrc; jj++){
      if( pExpr->w.iJoin==pSrcList->a[jj].iCursor ){
        if( (pSrcList->a[jj].fg.jointype & JT_LTORJ)!=0 ){
          return 0;  /* restriction (6) */
        }
        break;
      }
    }
  }
  /* Rules (1), (2a), and (2b) handled by the following: */
  return sqlite3ExprIsTableConstant(pExpr, pSrc->iCursor, bAllowSubq);
}